

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O2

int PAL_iswdigit(char16_t c)

{
  BOOL BVar1;
  uint uVar2;
  undefined8 in_RAX;
  UnicodeDataRec local_18;
  UnicodeDataRec dataRec;
  
  local_18.C1_TYPE_FLAGS = (WORD)((ulong)in_RAX >> 0x10);
  if (PAL_InitializeChakraCoreCalled) {
    BVar1 = GetUnicodeData((uint)(ushort)c,&local_18);
    if (BVar1 == 0) {
      uVar2 = 0;
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00312e6a;
    }
    else {
      uVar2 = local_18.C1_TYPE_FLAGS >> 2 & 1;
    }
    if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
      return uVar2;
    }
  }
LAB_00312e6a:
  abort();
}

Assistant:

int
__cdecl
PAL_iswdigit( char16_t c )
{
    UINT nRetVal = 0;
#if HAVE_COREFOUNDATION
    static CFCharacterSetRef sDigitSet;

    if (sDigitSet == NULL)
    {
        sDigitSet = CFCharacterSetGetPredefined(
                                        kCFCharacterSetDecimalDigit);
    }
    PERF_ENTRY(iswdigit);
    ENTRY("PAL_iswdigit (c=%d)\n", c);
    nRetVal = CFCharacterSetIsCharacterMember(sDigitSet, c);
#else   /* HAVE_COREFOUNDATION */
    UnicodeDataRec dataRec;

    PERF_ENTRY(iswdigit);
    ENTRY("PAL_iswdigit (c=%d)\n", c);

    if (GetUnicodeData(c, &dataRec))
    {
        if (dataRec.C1_TYPE_FLAGS & C1_DIGIT)
        {
            nRetVal = 1;
        }
        else
        {
            nRetVal = 0;
        }
    }
    else
    {
        TRACE( "No corresponding unicode record for character %d.\n", c );
    }
#endif  /* HAVE_COREFOUNDATION */
    LOGEXIT("PAL_iswdigit returning %d\n", nRetVal);
    PERF_EXIT(iswdigit);
    return nRetVal;
}